

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O2

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  void *__ptr;
  int *__ptr_00;
  long lVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr_00 = (int *)S->content;
    if (__ptr_00 != (int *)0x0) {
      if (*(long *)(__ptr_00 + 0x20) != 0) {
        N_VDestroy(*(long *)(__ptr_00 + 0x20));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x20] = 0;
        __ptr_00[0x21] = 0;
      }
      if (*(long *)(__ptr_00 + 0x24) != 0) {
        N_VDestroy(*(long *)(__ptr_00 + 0x24));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x24] = 0;
        __ptr_00[0x25] = 0;
      }
      if (*(long *)(__ptr_00 + 0x18) != 0) {
        N_VDestroyVectorArray(*(long *)(__ptr_00 + 0x18),*__ptr_00 + 1);
        __ptr_00 = (int *)S->content;
        __ptr_00[0x18] = 0;
        __ptr_00[0x19] = 0;
      }
      if (*(long *)(__ptr_00 + 0x1a) != 0) {
        N_VDestroyVectorArray(*(long *)(__ptr_00 + 0x1a),*__ptr_00 + 1);
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1a] = 0;
        __ptr_00[0x1b] = 0;
      }
      if (*(long *)(__ptr_00 + 0x1c) != 0) {
        for (lVar1 = 0; lVar1 <= *__ptr_00; lVar1 = lVar1 + 1) {
          __ptr = *(void **)((long)*(void **)(__ptr_00 + 0x1c) + lVar1 * 8);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)(*(long *)((long)S->content + 0x70) + lVar1 * 8) = 0;
            __ptr_00 = (int *)S->content;
          }
        }
        free(*(void **)(__ptr_00 + 0x1c));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1c] = 0;
        __ptr_00[0x1d] = 0;
      }
      if (*(void **)(__ptr_00 + 0x1e) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x1e));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x1e] = 0;
        __ptr_00[0x1f] = 0;
      }
      if (*(void **)(__ptr_00 + 0x22) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x22));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x22] = 0;
        __ptr_00[0x23] = 0;
      }
      if (*(void **)(__ptr_00 + 0x26) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x26));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x26] = 0;
        __ptr_00[0x27] = 0;
      }
      if (*(void **)(__ptr_00 + 0x28) != (void *)0x0) {
        free(*(void **)(__ptr_00 + 0x28));
        __ptr_00 = (int *)S->content;
        __ptr_00[0x28] = 0;
        __ptr_00[0x29] = 0;
      }
      free(__ptr_00);
      S->content = (void *)0x0;
    }
    free(S->ops);
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPFGMR_CONTENT(S)->xcor)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->xcor);
      SPFGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPFGMR_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
      SPFGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPFGMR_CONTENT(S)->V)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->V = NULL;
    }
    if (SPFGMR_CONTENT(S)->Z)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->Z = NULL;
    }
    if (SPFGMR_CONTENT(S)->Hes)
    {
      for (k = 0; k <= SPFGMR_CONTENT(S)->maxl; k++)
      {
        if (SPFGMR_CONTENT(S)->Hes[k])
        {
          free(SPFGMR_CONTENT(S)->Hes[k]);
          SPFGMR_CONTENT(S)->Hes[k] = NULL;
        }
      }
      free(SPFGMR_CONTENT(S)->Hes);
      SPFGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPFGMR_CONTENT(S)->givens)
    {
      free(SPFGMR_CONTENT(S)->givens);
      SPFGMR_CONTENT(S)->givens = NULL;
    }
    if (SPFGMR_CONTENT(S)->yg)
    {
      free(SPFGMR_CONTENT(S)->yg);
      SPFGMR_CONTENT(S)->yg = NULL;
    }
    if (SPFGMR_CONTENT(S)->cv)
    {
      free(SPFGMR_CONTENT(S)->cv);
      SPFGMR_CONTENT(S)->cv = NULL;
    }
    if (SPFGMR_CONTENT(S)->Xv)
    {
      free(SPFGMR_CONTENT(S)->Xv);
      SPFGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}